

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

Aig_ManPre_t * Aig_ManRegManStart(Aig_Man_t *pAig,int nPartSize)

{
  int iVar1;
  Aig_ManPre_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Flt_t *pVVar7;
  float *pfVar8;
  char *pcVar9;
  
  pAVar2 = (Aig_ManPre_t *)calloc(1,0x50);
  pAVar2->pAig = pAig;
  pVVar3 = Aig_ManSupportsRegisters(pAig);
  pAVar2->vMatrix = pVVar3;
  pAVar2->nRegsMax = nPartSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 0x100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(0x800);
  pVVar3->pArray = ppvVar4;
  pAVar2->vParts = pVVar3;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x400);
  pVVar5->pArray = piVar6;
  pAVar2->vRegs = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x400);
  pVVar5->pArray = piVar6;
  pAVar2->vUniques = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x400);
  pVVar5->pArray = piVar6;
  pAVar2->vFreeVars = pVVar5;
  pVVar7 = (Vec_Flt_t *)malloc(0x10);
  pVVar7->nCap = 0x100;
  pVVar7->nSize = 0;
  pfVar8 = (float *)malloc(0x400);
  pVVar7->pArray = pfVar8;
  pAVar2->vPartCost = pVVar7;
  iVar1 = pAig->nRegs;
  pcVar9 = (char *)calloc(1,(long)iVar1);
  pAVar2->pfUsedRegs = pcVar9;
  pcVar9 = (char *)malloc((long)iVar1);
  pAVar2->pfPartVars = pcVar9;
  return pAVar2;
}

Assistant:

Aig_ManPre_t * Aig_ManRegManStart( Aig_Man_t * pAig, int nPartSize )
{
    Aig_ManPre_t * p;
    p = ABC_ALLOC( Aig_ManPre_t, 1 );
    memset( p, 0, sizeof(Aig_ManPre_t) );
    p->pAig      = pAig;
    p->vMatrix   = Aig_ManSupportsRegisters( pAig );
    p->nRegsMax  = nPartSize;
    p->vParts    = Vec_PtrAlloc(256);
    p->vRegs     = Vec_IntAlloc(256);
    p->vUniques  = Vec_IntAlloc(256);
    p->vFreeVars = Vec_IntAlloc(256);
    p->vPartCost = Vec_FltAlloc(256);
    p->pfUsedRegs = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    memset( p->pfUsedRegs, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
    p->pfPartVars  = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    return p;
}